

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_dictContentType_e dictContentType;
  ZSTD_cStreamStage ZVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  ZSTD_freeFunction p_Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ZSTD_customMem cMem;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters cParams_00;
  ZSTD_CCtx_params params;
  bool bVar10;
  size_t err_code;
  size_t sVar11;
  ZSTD_CDict *pZVar12;
  ZSTDMT_CCtx *mtctx;
  size_t sVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  char *dst;
  undefined8 *puVar17;
  undefined8 *puVar18;
  void *__src;
  uint nbWorkers;
  size_t err_code_1;
  ulong uVar19;
  char *dst_00;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  unsigned_long_long srcSizeHint;
  bool bVar23;
  byte bVar24;
  ZSTD_allocFunction in_stack_fffffffffffffcf8;
  uint in_stack_fffffffffffffd00;
  uint in_stack_fffffffffffffd04;
  uint in_stack_fffffffffffffd08;
  uint in_stack_fffffffffffffd0c;
  ZSTD_strategy in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  ZSTD_allocFunction in_stack_fffffffffffffd18;
  ZSTD_freeFunction in_stack_fffffffffffffd20;
  void *in_stack_fffffffffffffd28;
  undefined1 auVar25 [24];
  undefined1 in_stack_fffffffffffffd30 [88];
  undefined1 auVar26 [24];
  undefined1 local_208 [8];
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  ZSTD_frameParameters local_1e8;
  int iStack_1dc;
  int iStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  int iStack_1c8;
  ZSTD_dictAttachPref_e ZStack_1c4;
  ZSTD_literalCompressionMode_e ZStack_1c0;
  size_t local_1b8;
  int iStack_1b0;
  int iStack_1ac;
  ldmParams_t lStack_1a8;
  ZSTD_allocFunction p_Stack_190;
  ZSTD_freeFunction p_Stack_188;
  void *pvStack_180;
  ZSTD_compressionParameters local_174;
  ZSTD_CCtx_params local_158;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  ZSTD_frameParameters ZStack_a8;
  int local_9c;
  int iStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int iStack_88;
  ZSTD_dictAttachPref_e ZStack_84;
  ZSTD_literalCompressionMode_e ZStack_80;
  uint local_7c;
  size_t local_78;
  int iStack_70;
  int iStack_6c;
  ldmParams_t lStack_68;
  ZSTD_allocFunction p_Stack_50;
  ZSTD_freeFunction p_Stack_48;
  void *pvStack_40;
  
  bVar24 = 0;
  if (output->size < output->pos) {
    return 0xffffffffffffffff;
  }
  if (input->size < input->pos) {
    return 0xffffffffffffffff;
  }
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx!=NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x39a7,
                  "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (cctx->streamStage == zcss_init) {
    local_208._0_4_ = (cctx->requestedParams).format;
    local_208._4_4_ = (cctx->requestedParams).cParams.windowLog;
    uStack_200._0_4_ = (cctx->requestedParams).cParams.chainLog;
    uStack_200._4_4_ = (cctx->requestedParams).cParams.hashLog;
    uStack_1f8._0_4_ = (cctx->requestedParams).cParams.searchLog;
    uStack_1f8._4_4_ = (cctx->requestedParams).cParams.minMatch;
    uStack_1f0._0_4_ = (cctx->requestedParams).cParams.targetLength;
    uStack_1f0._4_4_ = (cctx->requestedParams).cParams.strategy;
    local_1e8.contentSizeFlag = (cctx->requestedParams).fParams.contentSizeFlag;
    local_1e8.checksumFlag = (cctx->requestedParams).fParams.checksumFlag;
    uVar6 = (cctx->requestedParams).compressionLevel;
    uVar7 = (cctx->requestedParams).forceWindow;
    uVar8 = *(undefined8 *)&(cctx->requestedParams).field_0x34;
    uVar9 = *(undefined8 *)((long)&(cctx->requestedParams).targetCBlockSize + 4);
    ZStack_1c4 = (cctx->requestedParams).attachDictPref;
    ZStack_1c0 = (cctx->requestedParams).literalCompressionMode;
    local_1e8.noDictIDFlag = (int)*(undefined8 *)&(cctx->requestedParams).fParams.noDictIDFlag;
    uStack_1d4 = (undefined4)uVar8;
    uStack_1d0 = (undefined4)((ulong)uVar8 >> 0x20);
    uStack_1cc = (undefined4)uVar9;
    iStack_1c8 = (int)((ulong)uVar9 >> 0x20);
    uVar22 = (cctx->requestedParams).nbWorkers;
    lStack_1a8.hashRateLog = (cctx->requestedParams).ldmParams.hashRateLog;
    lStack_1a8.windowLog = (cctx->requestedParams).ldmParams.windowLog;
    p_Stack_190 = (cctx->requestedParams).customMem.customAlloc;
    p_Stack_188 = (cctx->requestedParams).customMem.customFree;
    pvStack_180 = (cctx->requestedParams).customMem.opaque;
    local_1b8 = (cctx->requestedParams).jobSize;
    iStack_1b0 = (cctx->requestedParams).overlapLog;
    iStack_1ac = (cctx->requestedParams).rsyncable;
    lStack_1a8.enableLdm = (cctx->requestedParams).ldmParams.enableLdm;
    lStack_1a8.hashLog = (cctx->requestedParams).ldmParams.hashLog;
    lStack_1a8.bucketSizeLog = (cctx->requestedParams).ldmParams.bucketSizeLog;
    lStack_1a8.minMatchLength = (cctx->requestedParams).ldmParams.minMatchLength;
    pvVar2 = (cctx->prefixDict).dict;
    sVar11 = (cctx->prefixDict).dictSize;
    dictContentType = (cctx->prefixDict).dictContentType;
    iStack_1dc = uVar6;
    iStack_1d8 = uVar7;
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_compressionParameters *)&local_158,&cctx->requestedParams,0xffffffffffffffff,
               (cctx->localDict).dictSize);
    pvVar3 = (cctx->localDict).dict;
    if (pvVar3 == (void *)0x0) {
      if ((cctx->localDict).dictBuffer != (void *)0x0) {
        __assert_fail("dl->dictBuffer == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2da6,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      if ((cctx->localDict).cdict != (ZSTD_CDict *)0x0) {
        __assert_fail("dl->cdict == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2da7,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      if ((cctx->localDict).dictSize != 0) {
        __assert_fail("dl->dictSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2da8,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
    }
    else {
      pZVar12 = (cctx->localDict).cdict;
      if (pZVar12 == (ZSTD_CDict *)0x0) {
        sVar13 = (cctx->localDict).dictSize;
        if (sVar13 == 0) {
          __assert_fail("dl->dictSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2db0,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
        }
        if (cctx->cdict != (ZSTD_CDict *)0x0) {
          __assert_fail("cctx->cdict == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2db1,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
        }
        if ((cctx->prefixDict).dict != (void *)0x0) {
          __assert_fail("cctx->prefixDict.dict == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2db2,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
        }
        in_stack_fffffffffffffd28 = (cctx->customMem).opaque;
        in_stack_fffffffffffffd18 = (cctx->customMem).customAlloc;
        in_stack_fffffffffffffd20 = (cctx->customMem).customFree;
        in_stack_fffffffffffffcf8 =
             (ZSTD_allocFunction)CONCAT44(local_158.cParams.windowLog,local_158.format);
        cParams.hashLog = local_158.cParams.chainLog;
        cParams._0_8_ = in_stack_fffffffffffffcf8;
        cParams.searchLog = local_158.cParams.hashLog;
        cParams.minMatch = local_158.cParams.searchLog;
        cParams.targetLength = local_158.cParams.minMatch;
        cParams.strategy = local_158.cParams.targetLength;
        in_stack_fffffffffffffd00 = local_158.cParams.chainLog;
        in_stack_fffffffffffffd10 = local_158.cParams.targetLength;
        pZVar12 = ZSTD_createCDict_advanced
                            (pvVar3,sVar13,ZSTD_dlm_byRef,(cctx->localDict).dictContentType,cParams,
                             cctx->customMem);
        (cctx->localDict).cdict = pZVar12;
        if (pZVar12 == (ZSTD_CDict *)0x0) {
          return 0xffffffffffffffc0;
        }
        cctx->cdict = pZVar12;
        in_stack_fffffffffffffd04 = local_158.cParams.hashLog;
        in_stack_fffffffffffffd08 = local_158.cParams.searchLog;
        in_stack_fffffffffffffd0c = local_158.cParams.minMatch;
      }
      else if (cctx->cdict != pZVar12) {
        __assert_fail("cctx->cdict == dl->cdict",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2dac,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
    }
    (cctx->prefixDict).dict = (void *)0x0;
    (cctx->prefixDict).dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    if ((pvVar2 != (void *)0x0) && (cctx->cdict != (ZSTD_CDict *)0x0)) {
      __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x39af,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    if (endOp == ZSTD_e_end) {
      sVar13 = input->size;
      cctx->pledgedSrcSizePlusOne = sVar13 + 1;
    }
    else {
      sVar13 = cctx->pledgedSrcSizePlusOne - 1;
    }
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_compressionParameters *)(local_208 + 4),&cctx->requestedParams,sVar13,0);
    srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
    nbWorkers = 0;
    if (0x100000 < srcSizeHint) {
      nbWorkers = uVar22;
    }
    if ((int)nbWorkers < 1) {
      pZVar12 = cctx->cdict;
      local_158.srcSizeHint = iStack_1c8;
      local_158.attachDictPref = ZStack_1c4;
      local_158.literalCompressionMode = ZStack_1c0;
      local_158.fParams.contentSizeFlag = local_1e8.contentSizeFlag;
      local_158.fParams.checksumFlag = local_1e8.checksumFlag;
      local_158.fParams.noDictIDFlag = local_1e8.noDictIDFlag;
      local_158.compressionLevel = iStack_1dc;
      local_158.forceWindow = iStack_1d8;
      local_158._52_4_ = uStack_1d4;
      local_158.targetCBlockSize._0_4_ = uStack_1d0;
      local_158.targetCBlockSize._4_4_ = uStack_1cc;
      local_158.format = local_208._0_4_;
      local_158.cParams.windowLog = local_208._4_4_;
      local_158.cParams.chainLog = (uint)uStack_200;
      local_158.cParams.hashLog = (uint)((ulong)uStack_200 >> 0x20);
      local_158.cParams.searchLog = (uint)uStack_1f8;
      local_158.cParams.minMatch = (uint)((ulong)uStack_1f8 >> 0x20);
      local_158.cParams.targetLength = (uint)uStack_1f0;
      local_158.cParams.strategy = (ZSTD_strategy)((ulong)uStack_1f0 >> 0x20);
      local_158.jobSize = local_1b8;
      local_158.overlapLog = iStack_1b0;
      local_158.rsyncable = iStack_1ac;
      local_158.ldmParams.enableLdm = lStack_1a8.enableLdm;
      local_158.ldmParams.hashLog = lStack_1a8.hashLog;
      local_158.ldmParams.bucketSizeLog = lStack_1a8.bucketSizeLog;
      local_158.ldmParams.minMatchLength = lStack_1a8.minMatchLength;
      local_158.ldmParams.hashRateLog = lStack_1a8.hashRateLog;
      local_158.ldmParams.windowLog = lStack_1a8.windowLog;
      local_158.customMem.customAlloc = p_Stack_190;
      local_158.customMem.customFree = p_Stack_188;
      local_158.customMem.opaque = pvStack_180;
      local_158.nbWorkers = nbWorkers;
      ZSTD_getCParamsFromCCtxParams(&local_174,&local_158,srcSizeHint,sVar11);
      local_158.cParams.targetLength = local_174.targetLength;
      local_158.cParams.strategy = local_174.strategy;
      local_158.cParams.windowLog = local_174.windowLog;
      local_158.cParams.chainLog = local_174.chainLog;
      cParams_00.hashLog = local_174.hashLog;
      cParams_00.windowLog = local_174.windowLog;
      cParams_00.chainLog = local_174.chainLog;
      cParams_00.searchLog = local_174.searchLog;
      cParams_00.minMatch = local_174.minMatch;
      cParams_00.targetLength = local_158.cParams.targetLength;
      cParams_00.strategy = local_158.cParams.strategy;
      sVar13 = ZSTD_checkCParams(cParams_00);
      if (0xffffffffffffff88 < sVar13) {
        __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3867,
                      "size_t ZSTD_resetCStream_internal(ZSTD_CStream *, const void *const, const size_t, const ZSTD_dictContentType_e, const ZSTD_CDict *const, ZSTD_CCtx_params, const unsigned long long)"
                     );
      }
      if (pZVar12 != (ZSTD_CDict *)0x0 && pvVar2 != (void *)0x0) {
        __assert_fail("!((dict) && (cdict))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3868,
                      "size_t ZSTD_resetCStream_internal(ZSTD_CStream *, const void *const, const size_t, const ZSTD_dictContentType_e, const ZSTD_CDict *const, ZSTD_CCtx_params, const unsigned long long)"
                     );
      }
      uVar22 = 0;
      sVar11 = ZSTD_compressBegin_internal
                         (cctx,pvVar2,sVar11,dictContentType,ZSTD_dtlm_fast,pZVar12,&local_158,
                          srcSizeHint,ZSTDb_buffered);
      if (0xffffffffffffff88 < sVar11) {
        return sVar11;
      }
      cctx->inToCompress = 0;
      cctx->inBuffPos = 0;
      cctx->inBuffTarget = (ulong)(cctx->blockSize == srcSizeHint) + cctx->blockSize;
      cctx->outBuffContentSize = 0;
      cctx->outBuffFlushedSize = 0;
      cctx->streamStage = zcss_load;
      cctx->frameEnded = 0;
      if ((cctx->appliedParams).nbWorkers != 0) {
        __assert_fail("cctx->appliedParams.nbWorkers == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x39d1,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
    }
    else {
      mtctx = cctx->mtctx;
      if (mtctx == (ZSTDMT_CCtx *)0x0) {
        pvVar3 = (cctx->customMem).opaque;
        in_stack_fffffffffffffd08 = (uint)pvVar3;
        in_stack_fffffffffffffd0c = (uint)((ulong)pvVar3 >> 0x20);
        in_stack_fffffffffffffcf8 = (cctx->customMem).customAlloc;
        p_Var5 = (cctx->customMem).customFree;
        in_stack_fffffffffffffd00 = (uint)p_Var5;
        in_stack_fffffffffffffd04 = (uint)((ulong)p_Var5 >> 0x20);
        cMem.customFree._4_4_ = in_stack_fffffffffffffd04;
        cMem._0_12_ = *(undefined1 (*) [12])&cctx->customMem;
        cMem.opaque._0_4_ = in_stack_fffffffffffffd08;
        cMem.opaque._4_4_ = in_stack_fffffffffffffd0c;
        mtctx = ZSTDMT_createCCtx_advanced(nbWorkers,cMem);
        cctx->mtctx = mtctx;
        if (mtctx == (ZSTDMT_CCtx *)0x0) {
          return 0xffffffffffffffc0;
        }
        srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
      }
      pZVar12 = cctx->cdict;
      iStack_88 = iStack_1c8;
      ZStack_84 = ZStack_1c4;
      ZStack_80 = ZStack_1c0;
      ZStack_a8.contentSizeFlag = local_1e8.contentSizeFlag;
      ZStack_a8.checksumFlag = local_1e8.checksumFlag;
      ZStack_a8.noDictIDFlag = local_1e8.noDictIDFlag;
      local_9c = iStack_1dc;
      iStack_98 = iStack_1d8;
      uStack_94 = uStack_1d4;
      uStack_90 = uStack_1d0;
      uStack_8c = uStack_1cc;
      local_c8 = local_208;
      uStack_c0 = uStack_200;
      uStack_b8 = uStack_1f8;
      uStack_b0 = uStack_1f0;
      local_7c = nbWorkers;
      local_78 = local_1b8;
      iStack_70 = iStack_1b0;
      iStack_6c = iStack_1ac;
      lStack_68.enableLdm = lStack_1a8.enableLdm;
      lStack_68.hashLog = lStack_1a8.hashLog;
      lStack_68.bucketSizeLog = lStack_1a8.bucketSizeLog;
      lStack_68.minMatchLength = lStack_1a8.minMatchLength;
      lStack_68.hashRateLog = lStack_1a8.hashRateLog;
      lStack_68.windowLog = lStack_1a8.windowLog;
      p_Stack_50 = p_Stack_190;
      p_Stack_48 = p_Stack_188;
      pvStack_40 = pvStack_180;
      puVar17 = &local_c8;
      puVar18 = (undefined8 *)&stack0xfffffffffffffcf8;
      for (lVar15 = 0x12; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar18 = *puVar17;
        puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
        puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
      }
      params.cParams.chainLog = in_stack_fffffffffffffd00;
      params._0_8_ = in_stack_fffffffffffffcf8;
      params.cParams.hashLog = in_stack_fffffffffffffd04;
      params.cParams.searchLog = in_stack_fffffffffffffd08;
      params.cParams.minMatch = in_stack_fffffffffffffd0c;
      params.cParams.targetLength = in_stack_fffffffffffffd10;
      params.cParams.strategy = in_stack_fffffffffffffd14;
      params.fParams._0_8_ = in_stack_fffffffffffffd18;
      params._40_8_ = in_stack_fffffffffffffd20;
      params._48_8_ = in_stack_fffffffffffffd28;
      auVar25 = in_stack_fffffffffffffd30._40_24_;
      auVar26 = in_stack_fffffffffffffd30._64_24_;
      params.targetCBlockSize = in_stack_fffffffffffffd30._0_8_;
      params.srcSizeHint = in_stack_fffffffffffffd30._8_4_;
      params.attachDictPref = in_stack_fffffffffffffd30._12_4_;
      params.literalCompressionMode = in_stack_fffffffffffffd30._16_4_;
      params.nbWorkers = in_stack_fffffffffffffd30._20_4_;
      params.jobSize = in_stack_fffffffffffffd30._24_8_;
      params.overlapLog = in_stack_fffffffffffffd30._32_4_;
      params.rsyncable = in_stack_fffffffffffffd30._36_4_;
      params.ldmParams.enableLdm = auVar25._0_4_;
      params.ldmParams.hashLog = auVar25._4_4_;
      params.ldmParams.bucketSizeLog = auVar25._8_4_;
      params.ldmParams.minMatchLength = auVar25._12_4_;
      params.ldmParams.hashRateLog = auVar25._16_4_;
      params.ldmParams.windowLog = auVar25._20_4_;
      params.customMem.customAlloc = (ZSTD_allocFunction)auVar26._0_8_;
      params.customMem.customFree = (ZSTD_freeFunction)auVar26._8_8_;
      params.customMem.opaque = (void *)auVar26._16_8_;
      sVar11 = ZSTDMT_initCStream_internal
                         (mtctx,pvVar2,sVar11,ZSTD_dct_rawContent,pZVar12,params,srcSizeHint);
      if (0xffffffffffffff88 < sVar11) {
        return sVar11;
      }
      cctx->streamStage = zcss_load;
      (cctx->appliedParams).nbWorkers = nbWorkers;
    }
  }
  else {
    uVar22 = (cctx->appliedParams).nbWorkers;
  }
  if (0 < (int)uVar22) {
    if (ZSTD_e_end < endOp) {
      __assert_fail("forceMaxProgress || endOp == ZSTD_e_continue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x39da,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    if (cctx->cParamsChanged != 0) {
      ZSTDMT_updateCParams_whileCompressing(cctx->mtctx,&cctx->requestedParams);
      cctx->cParamsChanged = 0;
    }
    while( true ) {
      sVar11 = ZSTDMT_compressStream_generic(cctx->mtctx,output,input,endOp);
      if ((0xffffffffffffff88 < sVar11) || (endOp == ZSTD_e_end && sVar11 == 0)) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
        return sVar11;
      }
      if (endOp + ~ZSTD_e_end < 0xfffffffe) {
        return sVar11;
      }
      if (sVar11 == 0) break;
      if (output->size <= output->pos) {
        if (output->pos == output->size) {
          return sVar11;
        }
        __assert_fail("!forceMaxProgress || flushMin == 0 || output->pos == output->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x39eb,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
    }
    return 0;
  }
  if (cctx->inBuff == (char *)0x0) {
    __assert_fail("zcs->inBuff != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x390d,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (cctx->inBuffSize == 0) {
    __assert_fail("zcs->inBuffSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x390e,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (cctx->outBuff == (char *)0x0) {
    __assert_fail("zcs->outBuff != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x390f,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (cctx->outBuffSize == 0) {
    __assert_fail("zcs->outBuffSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3910,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (output->size < output->pos) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3911,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (input->size < input->pos) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3912,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  pvVar2 = input->src;
  pvVar14 = (void *)(input->size + (long)pvVar2);
  pvVar3 = output->dst;
  pcVar20 = (char *)(output->size + (long)pvVar3);
  bVar10 = false;
  __src = (void *)(input->pos + (long)pvVar2);
  dst_00 = (char *)(output->pos + (long)pvVar3);
LAB_00141e08:
  while( true ) {
    if (bVar10) {
      input->pos = (long)__src - (long)pvVar2;
      output->pos = (long)dst_00 - (long)pvVar3;
      if (cctx->frameEnded == 0) {
        uVar19 = cctx->inBuffTarget - cctx->inBuffPos;
        if (uVar19 == 0) {
          uVar19 = cctx->blockSize;
        }
        if (0xffffffffffffff88 < uVar19) {
          return uVar19;
        }
      }
      return cctx->outBuffContentSize - cctx->outBuffFlushedSize;
    }
    ZVar1 = cctx->streamStage;
    if (ZVar1 == zcss_load) break;
    if (ZVar1 != zcss_flush) {
      if (ZVar1 == zcss_init) {
        return 0xffffffffffffffc2;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3981,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    uVar19 = cctx->outBuffContentSize;
    sVar11 = cctx->outBuffFlushedSize;
    uVar21 = (long)pcVar20 - (long)dst_00;
LAB_001420a6:
    uVar19 = uVar19 - sVar11;
    uVar16 = uVar19;
    if (uVar21 < uVar19) {
      uVar16 = uVar21;
    }
    if (uVar16 != 0) {
      memcpy(dst_00,cctx->outBuff + sVar11,uVar16);
      sVar11 = cctx->outBuffFlushedSize;
    }
    dst_00 = dst_00 + uVar16;
    cctx->outBuffFlushedSize = sVar11 + uVar16;
    if (uVar21 < uVar19) {
      bVar10 = true;
      bVar23 = dst_00 != pcVar20;
      dst_00 = pcVar20;
      if (bVar23) {
        __assert_fail("op==oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3971,
                      "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                     );
      }
    }
    else {
      cctx->outBuffContentSize = 0;
      cctx->outBuffFlushedSize = 0;
      if (cctx->frameEnded == 0) {
        cctx->streamStage = zcss_load;
        bVar10 = false;
      }
      else {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
        bVar10 = true;
      }
    }
  }
  if (endOp == ZSTD_e_end) {
    uVar19 = (long)pvVar14 - (long)__src;
    uVar21 = (ulong)(0x20000U - (int)uVar19 >> 0xb);
    if (0x1ffff < uVar19) {
      uVar21 = 0;
    }
    sVar11 = cctx->inBuffPos;
    if (sVar11 == 0 && uVar21 + (uVar19 >> 8) + uVar19 <= (ulong)((long)pcVar20 - (long)dst_00)) {
      sVar11 = ZSTD_compressEnd(cctx,dst_00,(long)pcVar20 - (long)dst_00,__src,uVar19);
      if (0xffffffffffffff88 < sVar11) {
        return sVar11;
      }
      cctx->streamStage = zcss_init;
      cctx->frameEnded = 1;
      cctx->pledgedSrcSizePlusOne = 0;
      dst_00 = dst_00 + sVar11;
      bVar10 = true;
      __src = pvVar14;
      goto LAB_00141e08;
    }
  }
  else {
    sVar11 = cctx->inBuffPos;
    uVar19 = (long)pvVar14 - (long)__src;
  }
  uVar21 = cctx->inBuffTarget - sVar11;
  if (uVar19 <= uVar21) {
    uVar21 = uVar19;
  }
  if (uVar21 != 0) {
    memcpy(cctx->inBuff + sVar11,__src,uVar21);
    sVar11 = cctx->inBuffPos;
  }
  uVar19 = sVar11 + uVar21;
  cctx->inBuffPos = uVar19;
  __src = (void *)((long)__src + uVar21);
  if (endOp == ZSTD_e_flush) {
    bVar10 = true;
    if (uVar19 == cctx->inToCompress) goto LAB_00141e08;
  }
  else if ((endOp == ZSTD_e_continue) && (bVar10 = true, uVar19 < cctx->inBuffTarget))
  goto LAB_00141e08;
  sVar11 = uVar19 - cctx->inToCompress;
  uVar21 = (long)pcVar20 - (long)dst_00;
  uVar19 = (ulong)(0x20000U - (int)sVar11 >> 0xb);
  if (0x1ffff < sVar11) {
    uVar19 = 0;
  }
  sVar13 = uVar21;
  dst = dst_00;
  if (uVar21 < uVar19 + (sVar11 >> 8) + sVar11) {
    dst = cctx->outBuff;
    sVar13 = cctx->outBuffSize;
  }
  if (endOp == ZSTD_e_end && __src == pvVar14) {
    uVar19 = ZSTD_compressEnd(cctx,dst,sVar13,cctx->inBuff + cctx->inToCompress,sVar11);
  }
  else {
    uVar19 = ZSTD_compressContinue(cctx,dst,sVar13,cctx->inBuff + cctx->inToCompress,sVar11);
  }
  if (0xffffffffffffff88 < uVar19) {
    return uVar19;
  }
  uVar22 = (uint)(endOp == ZSTD_e_end && __src == pvVar14);
  cctx->frameEnded = uVar22;
  sVar11 = cctx->inBuffPos;
  uVar4 = cctx->blockSize;
  uVar16 = uVar4 + sVar11;
  cctx->inBuffTarget = uVar16;
  if (cctx->inBuffSize < uVar16) {
    cctx->inBuffPos = 0;
    cctx->inBuffTarget = uVar4;
    sVar11 = 0;
    uVar16 = uVar4;
  }
  if (uVar22 == 0) {
    if (cctx->inBuffSize < uVar16) {
      __assert_fail("zcs->inBuffTarget <= zcs->inBuffSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3955,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    cctx->inToCompress = sVar11;
    if (dst != dst_00) goto LAB_0014208b;
    bVar10 = false;
  }
  else {
    cctx->inToCompress = sVar11;
    if (dst != dst_00) {
LAB_0014208b:
      cctx->outBuffContentSize = uVar19;
      cctx->outBuffFlushedSize = 0;
      cctx->streamStage = zcss_flush;
      sVar11 = 0;
      goto LAB_001420a6;
    }
    cctx->streamStage = zcss_init;
    cctx->pledgedSrcSizePlusOne = 0;
    bVar10 = true;
    __src = pvVar14;
  }
  dst_00 = dst_00 + uVar19;
  goto LAB_00141e08;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, GENERIC);
    RETURN_ERROR_IF(input->pos  > input->size, GENERIC);
    assert(cctx!=NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        ZSTD_CCtx_params params = cctx->requestedParams;
        ZSTD_prefixDict const prefixDict = cctx->prefixDict;
        FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) ); /* Init the local dict if present. */
        memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
        assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
        DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
        if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = input->size + 1;  /* auto-fix pledgedSrcSize */
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, 0 /*dictSize*/);


#ifdef ZSTD_MULTITHREAD
        if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
            params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
        }
        if (params.nbWorkers > 0) {
            /* mt context creation */
            if (cctx->mtctx == NULL) {
                DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                            params.nbWorkers);
                cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem);
                RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation);
            }
            /* mt compression */
            DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
            FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                        cctx->mtctx,
                        prefixDict.dict, prefixDict.dictSize, ZSTD_dct_rawContent,
                        cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) );
            cctx->streamStage = zcss_load;
            cctx->appliedParams.nbWorkers = params.nbWorkers;
        } else
#endif
        {   FORWARD_IF_ERROR( ZSTD_resetCStream_internal(cctx,
                            prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                            cctx->cdict,
                            params, cctx->pledgedSrcSizePlusOne-1) );
            assert(cctx->streamStage == zcss_load);
            assert(cctx->appliedParams.nbWorkers == 0);
    }   }
    /* end of transparent initialization stage */

    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        int const forceMaxProgress = (endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
        size_t flushMin;
        assert(forceMaxProgress || endOp == ZSTD_e_continue /* Protection for a new flush type */);
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        do {
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin);
        } while (forceMaxProgress && flushMin != 0 && output->pos < output->size);
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(!forceMaxProgress || flushMin == 0 || output->pos == output->size);
        return flushMin;
    }
#endif
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) );
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}